

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  uint num_rects;
  stbrp_rect *rects;
  long lVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ImVector<stbrp_rect> pack_rects;
  
  num_rects = (atlas->CustomRects).Size;
  uVar6 = 8;
  if (8 < num_rects) {
    uVar6 = (ulong)num_rects;
  }
  rects = (stbrp_rect *)ImGui::MemAlloc(uVar6 * 0x18);
  memset(rects,0,(ulong)num_rects * 0x18);
  if (0 < (atlas->CustomRects).Size) {
    lVar1 = 0;
    lVar2 = 0;
    lVar4 = 0;
    do {
      *(uint *)((long)&rects->w + lVar1) =
           (uint)*(ushort *)((long)&((atlas->CustomRects).Data)->Width + lVar2);
      *(uint *)((long)&rects->h + lVar1) =
           (uint)*(ushort *)((long)&((atlas->CustomRects).Data)->Height + lVar2);
      lVar4 = lVar4 + 1;
      lVar2 = lVar2 + 0x20;
      lVar1 = lVar1 + 0x18;
    } while (lVar4 < (atlas->CustomRects).Size);
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,rects,num_rects);
  if ((long)(int)num_rects < 1) {
    if (rects == (stbrp_rect *)0x0) {
      return;
    }
  }
  else {
    piVar3 = &rects->was_packed;
    lVar1 = 0;
    uVar6 = 0;
    do {
      if (*piVar3 != 0) {
        *(short *)((long)&((atlas->CustomRects).Data)->X + lVar1) = (short)piVar3[-2];
        *(short *)((long)&((atlas->CustomRects).Data)->Y + lVar1) = (short)piVar3[-1];
        iVar5 = piVar3[-3] + piVar3[-1];
        if (piVar3[-3] + piVar3[-1] < atlas->TexHeight) {
          iVar5 = atlas->TexHeight;
        }
        atlas->TexHeight = iVar5;
      }
      uVar6 = uVar6 + 1;
      piVar3 = piVar3 + 6;
      lVar1 = lVar1 + 0x20;
    } while (uVar6 < (ulong)(long)(int)num_rects);
  }
  ImGui::MemFree(rects);
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = (unsigned short)pack_rects[i].x;
            user_rects[i].Y = (unsigned short)pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}